

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

art_ref_t art_insert_at(art_t *art,art_ref_t ref,art_key_chunk_t *key,uint8_t depth,
                       art_ref_t new_leaf)

{
  art_inner_node_t *node;
  byte *pbVar1;
  art_node_t *paVar2;
  art_ref_t new_child;
  void *__dest;
  uint64_t uVar3;
  art_ref_t aVar4;
  byte bVar5;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  ulong uVar9;
  art_inner_node_t *node_00;
  long lVar10;
  art_typecode_t typecode;
  
  uVar6 = ref & 0xff;
  uVar9 = (ulong)(uint)((int)uVar6 * 8);
  lVar8 = *(long *)((long)art->nodes + uVar9);
  lVar10 = (ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar9);
  node = (art_inner_node_t *)(lVar8 + lVar10);
  if (uVar6 == 1) {
    uVar9 = (ulong)depth;
    if ((uint8_t)(depth + 0xfa) == '\0') {
      bVar7 = 0;
    }
    else {
      bVar7 = -(depth + 0xfa);
      uVar6 = 0;
      do {
        if (*(art_key_chunk_t *)(lVar8 + lVar10 + uVar9 + uVar6) != key[uVar6 + uVar9]) {
          bVar7 = (byte)uVar6;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (bVar7 != uVar6);
    }
    uVar3 = art_allocate_index(art,'\x02');
    node_00 = (art_inner_node_t *)((long)art->nodes[2] + uVar3 * 0x30);
    pbVar1 = (byte *)((long)art->nodes[2] + uVar3 * 0x30);
    *pbVar1 = bVar7;
    memcpy(pbVar1 + 1,key + uVar9,(ulong)bVar7);
    pbVar1[6] = 0;
    lVar8 = bVar7 + uVar9;
    art_node4_insert(art,(art_node4_t *)node_00,ref,node->prefix[lVar8 + -1]);
    bVar7 = key[lVar8];
  }
  else {
    bVar7 = node->prefix_size;
    bVar5 = bVar7;
    if ((byte)(6 - depth) < bVar7) {
      bVar5 = 6 - depth;
    }
    if (bVar5 == 0) {
      bVar5 = 0;
    }
    else {
      uVar9 = 0;
      do {
        if (node->prefix[uVar9] != key[(uint)depth + (int)uVar9]) {
          bVar5 = (byte)uVar9;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (bVar5 != uVar9);
    }
    uVar9 = (ulong)bVar5;
    if (bVar5 == bVar7) {
      lVar8 = (uint)depth + uVar9;
      bVar7 = key[lVar8];
      aVar4 = art_find_child(node,(art_typecode_t)ref,bVar7);
      if (aVar4 == 0) {
        switch((uint)ref & 0xff) {
        case 2:
          node_00 = node;
          goto LAB_00106d63;
        case 3:
          aVar4 = art_node16_insert(art,(art_node16_t *)node,new_leaf,bVar7);
          return aVar4;
        case 4:
          aVar4 = art_node48_insert(art,(art_node48_t *)node,new_leaf,bVar7);
          return aVar4;
        case 5:
          *(art_ref_t *)((long)node + (ulong)bVar7 * 8 + 8) = new_leaf;
          *(short *)(node + 1) = *(short *)(node + 1) + 1;
          ref = ((ulong)((long)node - (long)art->nodes[5]) >> 3) * -0xff00ff00ff0000 | 5;
          break;
        default:
          ref = 0;
        }
      }
      else {
        new_child = art_insert_at(art,aVar4,key,(char)lVar8 + '\x01',new_leaf);
        if (new_child != aVar4) {
          art_replace((art_inner_node_t *)(lVar10 + (long)art->nodes[uVar6]),(art_typecode_t)ref,
                      bVar7,new_child);
        }
      }
      return ref;
    }
    __dest = roaring_malloc(uVar9);
    memcpy(__dest,node->prefix,uVar9);
    uVar3 = art_allocate_index(art,'\x02');
    node_00 = (art_inner_node_t *)((long)art->nodes[2] + uVar3 * 0x30);
    pbVar1 = (byte *)((long)art->nodes[2] + uVar3 * 0x30);
    *pbVar1 = bVar5;
    memcpy(pbVar1 + 1,__dest,uVar9);
    pbVar1[6] = 0;
    roaring_free(__dest);
    art_node4_insert(art,(art_node4_t *)node_00,ref,
                     *(uint8_t *)((long)art->nodes[uVar6] + uVar9 + 1 + lVar10));
    paVar2 = art->nodes[uVar6];
    bVar7 = ~bVar5 + *(char *)((long)paVar2 + lVar10);
    *(byte *)((long)paVar2 + lVar10) = bVar7;
    if (bVar7 != 0) {
      memmove((void *)((long)paVar2 + lVar10 + 1),(void *)((long)paVar2 + uVar9 + lVar10 + 2),
              (ulong)bVar7);
    }
    bVar7 = key[(uint)depth + uVar9];
  }
LAB_00106d63:
  aVar4 = art_node4_insert(art,(art_node4_t *)node_00,new_leaf,bVar7);
  return aVar4;
}

Assistant:

static art_ref_t art_insert_at(art_t *art, art_ref_t ref,
                               const art_key_chunk_t key[], uint8_t depth,
                               art_ref_t new_leaf) {
    if (art_is_leaf(ref)) {
        art_leaf_t *leaf = (art_leaf_t *)art_deref(art, ref);
        uint8_t common_prefix = art_common_prefix(
            leaf->key, depth, ART_KEY_BYTES, key, depth, ART_KEY_BYTES);

        // Previously this was a leaf, create an inner node instead and add
        // both the existing and new leaf to it.
        art_node_t *new_node =
            (art_node_t *)art_node4_create(art, key + depth, common_prefix);

        art_ref_t new_ref = art_node_insert_leaf(
            art, (art_inner_node_t *)new_node, CROARING_ART_NODE4_TYPE,
            leaf->key[depth + common_prefix], ref);
        new_ref = art_node_insert_leaf(art, (art_inner_node_t *)new_node,
                                       CROARING_ART_NODE4_TYPE,
                                       key[depth + common_prefix], new_leaf);

        // The new inner node is now the rootmost node.
        return new_ref;
    }
    art_inner_node_t *inner_node = (art_inner_node_t *)art_deref(art, ref);
    // Not a leaf: inner node
    uint8_t common_prefix =
        art_common_prefix(inner_node->prefix, 0, inner_node->prefix_size, key,
                          depth, ART_KEY_BYTES);
    if (common_prefix != inner_node->prefix_size) {
        // Partial prefix match. Create a new internal node to hold the common
        // prefix.
        // We create a copy of the node's prefix as the creation of a new
        // node may invalidate the prefix pointer.
        art_key_chunk_t *prefix_copy = (art_key_chunk_t *)roaring_malloc(
            common_prefix * sizeof(art_key_chunk_t));
        memcpy(prefix_copy, inner_node->prefix,
               common_prefix * sizeof(art_key_chunk_t));
        art_node4_t *node4 = art_node4_create(art, prefix_copy, common_prefix);
        roaring_free(prefix_copy);

        // Deref as a new node was created.
        inner_node = (art_inner_node_t *)art_deref(art, ref);

        // Make the existing internal node a child of the new internal node.
        art_node4_insert(art, node4, ref, inner_node->prefix[common_prefix]);

        // Deref again as a new node was created.
        inner_node = (art_inner_node_t *)art_deref(art, ref);

        // Correct the prefix of the moved internal node, trimming off the
        // chunk inserted into the new internal node.
        inner_node->prefix_size = inner_node->prefix_size - common_prefix - 1;
        if (inner_node->prefix_size > 0) {
            // Move the remaining prefix to the correct position.
            memmove(inner_node->prefix, inner_node->prefix + common_prefix + 1,
                    inner_node->prefix_size);
        }

        // Insert the value in the new internal node.
        return art_node_insert_leaf(art, (art_inner_node_t *)node4,
                                    CROARING_ART_NODE4_TYPE,
                                    key[common_prefix + depth], new_leaf);
    }
    // Prefix matches entirely or node has no prefix. Look for an existing
    // child.
    art_key_chunk_t key_chunk = key[depth + common_prefix];
    art_ref_t child =
        art_find_child(inner_node, art_ref_typecode(ref), key_chunk);
    if (child != CROARING_ART_NULL_REF) {
        art_ref_t new_child =
            art_insert_at(art, child, key, depth + common_prefix + 1, new_leaf);
        if (new_child != child) {
            // Deref again as a new node may have been created.
            inner_node = (art_inner_node_t *)art_deref(art, ref);
            // Node type changed.
            art_replace(inner_node, art_ref_typecode(ref), key_chunk,
                        new_child);
        }
        return ref;
    }
    return art_node_insert_leaf(art, inner_node, art_ref_typecode(ref),
                                key_chunk, new_leaf);
}